

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509cset.cc
# Opt level: O0

int X509_REVOKED_set_serialNumber(X509_REVOKED *x,ASN1_INTEGER *serial)

{
  ASN1_INTEGER *local_28;
  ASN1_INTEGER *in;
  ASN1_INTEGER *serial_local;
  X509_REVOKED *revoked_local;
  
  if ((serial->type == 2) || (serial->type == 0x102)) {
    if (x == (X509_REVOKED *)0x0) {
      revoked_local._4_4_ = 0;
    }
    else {
      local_28 = x->serialNumber;
      if ((local_28 != serial) &&
         (local_28 = ASN1_INTEGER_dup(serial), local_28 != (ASN1_INTEGER *)0x0)) {
        ASN1_INTEGER_free(x->serialNumber);
        x->serialNumber = local_28;
      }
      revoked_local._4_4_ = (uint)(local_28 != (ASN1_INTEGER *)0x0);
    }
  }
  else {
    ERR_put_error(0xc,0,0xbf,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/x509cset.cc"
                  ,0xb3);
    revoked_local._4_4_ = 0;
  }
  return revoked_local._4_4_;
}

Assistant:

int X509_REVOKED_set_serialNumber(X509_REVOKED *revoked,
                                  const ASN1_INTEGER *serial) {
  ASN1_INTEGER *in;

  if (serial->type != V_ASN1_INTEGER && serial->type != V_ASN1_NEG_INTEGER) {
    OPENSSL_PUT_ERROR(ASN1, ASN1_R_WRONG_TYPE);
    return 0;
  }

  if (revoked == NULL) {
    return 0;
  }
  in = revoked->serialNumber;
  if (in != serial) {
    in = ASN1_INTEGER_dup(serial);
    if (in != NULL) {
      ASN1_INTEGER_free(revoked->serialNumber);
      revoked->serialNumber = in;
    }
  }
  return in != NULL;
}